

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O0

string * __thiscall
Sock::RecvUntilTerminator_abi_cxx11_
          (Sock *this,uint8_t terminator,milliseconds timeout,CThreadInterrupt *interrupt,
          size_t max_data)

{
  strong_ordering sVar1;
  size_type sVar2;
  runtime_error *prVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  long *in_RSI;
  string *in_RDI;
  ulong in_R9;
  long in_FS_OFFSET;
  bool bVar6;
  size_t append_len;
  char *terminator_pos;
  char *end;
  int err;
  bool terminator_found;
  string *data;
  duration<long,_std::ratio<1L,_1000L>_> wait_time;
  duration<long,_std::ratio<1L,_1000L>_> now;
  ssize_t read_ret;
  size_t try_len;
  ssize_t peek_ret;
  type deadline;
  char buf [512];
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffb80;
  type in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  strong_ordering in_stack_fffffffffffffbaf;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  char *local_430;
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [64];
  string local_248 [32];
  char local_228 [512];
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
  std::chrono::operator+
            ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb88.__r,
             in_stack_fffffffffffffb80);
  std::__cxx11::string::string(in_stack_fffffffffffffb90);
  do {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (in_R9 <= sVar2) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      tinyformat::format<unsigned_long>
                ((char *)CONCAT17(in_stack_fffffffffffffbaf._M_value,in_stack_fffffffffffffba8),
                 (unsigned_long *)in_stack_fffffffffffffba0);
      std::runtime_error::runtime_error(prVar3,local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00fa04ea:
      __stack_chk_fail();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    puVar4 = std::min<unsigned_long>
                       ((unsigned_long *)in_stack_fffffffffffffb80,
                        (unsigned_long *)
                        CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    local_430 = (char *)(**(code **)(*in_RSI + 0x20))(in_RSI,local_228,*puVar4,2);
    if (local_430 == (char *)0xffffffffffffffff) {
      __errno_location();
      bVar6 = IOErrorIsPermanent(in_stack_fffffffffffffb7c);
      if (bVar6) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        NetworkErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        tinyformat::format<std::__cxx11::string>
                  ((char *)CONCAT17(in_stack_fffffffffffffbaf._M_value,in_stack_fffffffffffffba8),
                   in_stack_fffffffffffffba0);
        std::runtime_error::runtime_error(prVar3,local_248);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00fa04ea;
      }
    }
    else {
      if (local_430 == (char *)0x0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Connection unexpectedly closed by peer");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00fa04ea;
      }
      pcVar5 = std::find<char*,unsigned_char>
                         ((char *)CONCAT17(in_stack_fffffffffffffbaf._M_value,
                                           in_stack_fffffffffffffba8),
                          (char *)in_stack_fffffffffffffba0,
                          (uchar *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98));
      bVar6 = pcVar5 != local_228 + (long)local_430;
      if (bVar6) {
        local_430 = pcVar5 + (1 - (long)local_228);
      }
      pcVar5 = (char *)(**(code **)(*in_RSI + 0x20))(in_RSI,local_228,local_430,0);
      if (((long)pcVar5 < 0) || (pcVar5 != local_430)) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<long,unsigned_long,long>
                  (in_stack_fffffffffffffbb8,(long *)in_stack_fffffffffffffbb0.__r,
                   (unsigned_long *)
                   CONCAT17(in_stack_fffffffffffffbaf._M_value,in_stack_fffffffffffffba8),
                   (long *)in_stack_fffffffffffffba0);
        std::runtime_error::runtime_error(prVar3,local_288);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00fa04ea;
      }
      in_stack_fffffffffffffbb8 = local_430;
      if (bVar6) {
        in_stack_fffffffffffffbb8 = local_430 + -1;
      }
      std::__cxx11::string::append<char*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
                 (char *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88.__r);
      if (bVar6) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          return in_RDI;
        }
        goto LAB_00fa04ea;
      }
    }
    in_stack_fffffffffffffbb0 = GetTime<std::chrono::duration<long,std::ratio<1l,1000l>>>();
    sVar1 = std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb90,
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb88.__r);
    in_stack_fffffffffffffbaf = sVar1;
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               (__unspec *)0xfa01b9);
    bVar6 = std::operator>=(sVar1._M_value);
    if (bVar6) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      tinyformat::format<unsigned_long>
                ((char *)CONCAT17(in_stack_fffffffffffffbaf._M_value,in_stack_fffffffffffffba8),
                 (unsigned_long *)prVar3);
      std::runtime_error::runtime_error(prVar3,local_2a8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00fa04ea;
    }
    in_stack_fffffffffffffb9f =
         CThreadInterrupt::operator_cast_to_bool
                   ((CThreadInterrupt *)
                    CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if ((bool)in_stack_fffffffffffffb9f) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
      tinyformat::format<unsigned_long>
                ((char *)CONCAT17(in_stack_fffffffffffffbaf._M_value,in_stack_fffffffffffffba8),
                 (unsigned_long *)in_stack_fffffffffffffba0);
      std::runtime_error::runtime_error(prVar3,local_2c8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00fa04ea;
    }
    in_stack_fffffffffffffb88 =
         std::chrono::operator-(in_stack_fffffffffffffb88.__r,in_stack_fffffffffffffb80);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
              (in_stack_fffffffffffffb80,
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffb80 =
         std::min<std::chrono::duration<long,std::ratio<1l,1000l>>>
                   ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb88.__r,
                    in_stack_fffffffffffffb80);
    (**(code **)(*in_RSI + 0x70))(in_RSI,in_stack_fffffffffffffb80->__r,1,0);
  } while( true );
}

Assistant:

std::string Sock::RecvUntilTerminator(uint8_t terminator,
                                      std::chrono::milliseconds timeout,
                                      CThreadInterrupt& interrupt,
                                      size_t max_data) const
{
    const auto deadline = GetTime<std::chrono::milliseconds>() + timeout;
    std::string data;
    bool terminator_found{false};

    // We must not consume any bytes past the terminator from the socket.
    // One option is to read one byte at a time and check if we have read a terminator.
    // However that is very slow. Instead, we peek at what is in the socket and only read
    // as many bytes as possible without crossing the terminator.
    // Reading 64 MiB of random data with 262526 terminator chars takes 37 seconds to read
    // one byte at a time VS 0.71 seconds with the "peek" solution below. Reading one byte
    // at a time is about 50 times slower.

    for (;;) {
        if (data.size() >= max_data) {
            throw std::runtime_error(
                strprintf("Received too many bytes without a terminator (%u)", data.size()));
        }

        char buf[512];

        const ssize_t peek_ret{Recv(buf, std::min(sizeof(buf), max_data - data.size()), MSG_PEEK)};

        switch (peek_ret) {
        case -1: {
            const int err{WSAGetLastError()};
            if (IOErrorIsPermanent(err)) {
                throw std::runtime_error(strprintf("recv(): %s", NetworkErrorString(err)));
            }
            break;
        }
        case 0:
            throw std::runtime_error("Connection unexpectedly closed by peer");
        default:
            auto end = buf + peek_ret;
            auto terminator_pos = std::find(buf, end, terminator);
            terminator_found = terminator_pos != end;

            const size_t try_len{terminator_found ? terminator_pos - buf + 1 :
                                                    static_cast<size_t>(peek_ret)};

            const ssize_t read_ret{Recv(buf, try_len, 0)};

            if (read_ret < 0 || static_cast<size_t>(read_ret) != try_len) {
                throw std::runtime_error(
                    strprintf("recv() returned %u bytes on attempt to read %u bytes but previous "
                              "peek claimed %u bytes are available",
                              read_ret, try_len, peek_ret));
            }

            // Don't include the terminator in the output.
            const size_t append_len{terminator_found ? try_len - 1 : try_len};

            data.append(buf, buf + append_len);

            if (terminator_found) {
                return data;
            }
        }

        const auto now = GetTime<std::chrono::milliseconds>();

        if (now >= deadline) {
            throw std::runtime_error(strprintf(
                "Receive timeout (received %u bytes without terminator before that)", data.size()));
        }

        if (interrupt) {
            throw std::runtime_error(strprintf(
                "Receive interrupted (received %u bytes without terminator before that)",
                data.size()));
        }

        // Wait for a short while (or the socket to become ready for reading) before retrying.
        const auto wait_time = std::min(deadline - now, std::chrono::milliseconds{MAX_WAIT_FOR_IO});
        (void)Wait(wait_time, RECV);
    }
}